

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O0

double get_value(shared_ptr<SchemeObject> *p,string *error_msg)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  eval_error *this;
  undefined1 local_48 [8];
  shared_ptr<SchemeFloat> pf;
  undefined1 local_30 [8];
  shared_ptr<SchemeInt> pi;
  string *error_msg_local;
  shared_ptr<SchemeObject> *p_local;
  
  pi.super___shared_ptr<SchemeInt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)error_msg;
  std::dynamic_pointer_cast<SchemeInt,SchemeObject>((shared_ptr<SchemeObject> *)local_30);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<SchemeInt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SchemeInt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_30);
    p_local = (shared_ptr<SchemeObject> *)(double)peVar2->value;
    pf.super___shared_ptr<SchemeFloat,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 1;
  }
  else {
    std::dynamic_pointer_cast<SchemeFloat,SchemeObject>((shared_ptr<SchemeObject> *)local_48);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48);
    if (!bVar1) {
      this = (eval_error *)__cxa_allocate_exception(0x10);
      eval_error::runtime_error
                (this,(string *)
                      pi.super___shared_ptr<SchemeInt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                );
      __cxa_throw(this,&eval_error::typeinfo,eval_error::~eval_error);
    }
    peVar3 = std::__shared_ptr_access<SchemeFloat,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SchemeFloat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_48);
    p_local = (shared_ptr<SchemeObject> *)peVar3->value;
    pf.super___shared_ptr<SchemeFloat,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 1;
    std::shared_ptr<SchemeFloat>::~shared_ptr((shared_ptr<SchemeFloat> *)local_48);
  }
  std::shared_ptr<SchemeInt>::~shared_ptr((shared_ptr<SchemeInt> *)local_30);
  return (double)p_local;
}

Assistant:

static double get_value(std::shared_ptr<SchemeObject> p, const std::string &error_msg)
{
    auto pi = std::dynamic_pointer_cast<SchemeInt>(p);
    if(pi)
        return pi->value;
    auto pf = std::dynamic_pointer_cast<SchemeFloat>(p);
    if(pf)
        return pf->value;
    throw eval_error(error_msg);
}